

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O2

char * MOS65XX_reg_name(csh handle,uint reg)

{
  if (5 < reg) {
    return (char *)0x0;
  }
  return RegNames_rel + *(int *)(RegNames_rel + (ulong)reg * 4);
}

Assistant:

const char* MOS65XX_reg_name(csh handle, unsigned int reg)
{
#ifdef CAPSTONE_DIET
	return NULL;
#else
	if (reg >= ARR_SIZE(RegNames)) {
		return NULL;
	}
	return RegNames[(int)reg];
#endif
}